

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxFunctionDefinition.h
# Opt level: O3

void __thiscall
Jinx::Impl::FunctionDefinition::FunctionDefinition
          (FunctionDefinition *this,FunctionSignature *signature,BufferPtr *bytecode,size_t offset)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  size_t sVar2;
  
  this->m_id = signature->m_id;
  sVar2 = FunctionSignature::GetParameterCount(signature);
  this->m_parameterCount = sVar2;
  (this->m_bytecode).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (bytecode->super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (bytecode->super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->m_bytecode).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->m_offset = offset;
  FunctionSignature::GetName_abi_cxx11_(&this->m_name,signature);
  (this->m_callback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_callback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_callback).super__Function_base._M_functor + 8) = 0;
  return;
}

Assistant:

FunctionDefinition(const FunctionSignature & signature, BufferPtr bytecode, size_t offset) :
			m_id(signature.GetId()),
			m_parameterCount(signature.GetParameterCount()),
            m_bytecode(bytecode),
            m_offset(offset),
            m_name(signature.GetName())
		{}